

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_utils.hpp
# Opt level: O2

float duckdb::alp::AlpUtils::FindFirstValueNotInPositionsArray<float>
                (float *input_vector,uint16_t *positions,idx_t values_count)

{
  ulong uVar1;
  
  uVar1 = 0;
  while( true ) {
    if (values_count == uVar1) {
      return 0.0;
    }
    if (uVar1 != positions[uVar1]) break;
    uVar1 = uVar1 + 1;
  }
  return input_vector[uVar1];
}

Assistant:

static T FindFirstValueNotInPositionsArray(const T *input_vector, const uint16_t *positions, idx_t values_count) {
		T a_non_special_value = 0;
		for (idx_t i = 0; i < values_count; i++) {
			if (i != positions[i]) {
				a_non_special_value = input_vector[i];
				break;
			}
		}
		return a_non_special_value;
	}